

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interpreter.cpp
# Opt level: O2

completion * __thiscall
mjs::interpreter::impl::operator()
          (completion *__return_storage_ptr__,impl *this,labelled_statement *s)

{
  pointer pbVar1;
  statement *s_00;
  __normal_iterator<std::basic_string_view<wchar_t,_std::char_traits<wchar_t>_>_*,_std::vector<std::basic_string_view<wchar_t,_std::char_traits<wchar_t>_>,_std::allocator<std::basic_string_view<wchar_t,_std::char_traits<wchar_t>_>_>_>_>
  _Var2;
  wostream *pwVar3;
  native_error_exception *this_00;
  pointer pbVar4;
  wstring_view local_200;
  wchar_t *local_1f0;
  size_t local_1e8;
  wstring local_1d0;
  wstring_view local_1b0;
  wostringstream woss;
  
  pbVar1 = (this->label_set_).
           super__Vector_base<std::basic_string_view<wchar_t,_std::char_traits<wchar_t>_>,_std::allocator<std::basic_string_view<wchar_t,_std::char_traits<wchar_t>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pbVar4 = (this->label_set_).
           super__Vector_base<std::basic_string_view<wchar_t,_std::char_traits<wchar_t>_>,_std::allocator<std::basic_string_view<wchar_t,_std::char_traits<wchar_t>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (pbVar4 != pbVar1 && (labelled_statement *)this->labels_valid_for_ != s) {
    (this->label_set_).
    super__Vector_base<std::basic_string_view<wchar_t,_std::char_traits<wchar_t>_>,_std::allocator<std::basic_string_view<wchar_t,_std::char_traits<wchar_t>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = pbVar1;
    pbVar4 = pbVar1;
  }
  _Var2 = std::
          __find_if<__gnu_cxx::__normal_iterator<std::basic_string_view<wchar_t,std::char_traits<wchar_t>>*,std::vector<std::basic_string_view<wchar_t,std::char_traits<wchar_t>>,std::allocator<std::basic_string_view<wchar_t,std::char_traits<wchar_t>>>>>,__gnu_cxx::__ops::_Iter_equals_val<std::__cxx11::wstring_const>>
                    (pbVar1,pbVar4,&s->id_);
  if (_Var2._M_current ==
      (this->label_set_).
      super__Vector_base<std::basic_string_view<wchar_t,_std::char_traits<wchar_t>_>,_std::allocator<std::basic_string_view<wchar_t,_std::char_traits<wchar_t>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    _woss = (s->id_)._M_string_length;
    std::
    vector<std::basic_string_view<wchar_t,std::char_traits<wchar_t>>,std::allocator<std::basic_string_view<wchar_t,std::char_traits<wchar_t>>>>
    ::emplace_back<std::basic_string_view<wchar_t,std::char_traits<wchar_t>>>
              ((vector<std::basic_string_view<wchar_t,std::char_traits<wchar_t>>,std::allocator<std::basic_string_view<wchar_t,std::char_traits<wchar_t>>>>
                *)&this->label_set_,(basic_string_view<wchar_t,_std::char_traits<wchar_t>_> *)&woss)
    ;
    s_00 = (s->s_)._M_t.super___uniq_ptr_impl<mjs::statement,_std::default_delete<mjs::statement>_>.
           _M_t.super__Tuple_impl<0UL,_mjs::statement_*,_std::default_delete<mjs::statement>_>.
           super__Head_base<0UL,_mjs::statement_*,_false>._M_head_impl;
    this->labels_valid_for_ = s_00;
    eval(__return_storage_ptr__,this,s_00);
    return __return_storage_ptr__;
  }
  std::__cxx11::wostringstream::wostringstream((wostringstream *)&woss);
  pwVar3 = std::operator<<((wostream *)&woss,"Duplicate label ");
  std::operator<<(pwVar3,(wstring *)&s->id_);
  this_00 = (native_error_exception *)__cxa_allocate_exception(0x58);
  stack_trace_abi_cxx11_(&local_1d0,this);
  local_200._M_len = local_1d0._M_string_length;
  local_200._M_str = local_1d0._M_dataplus._M_p;
  std::__cxx11::wstringbuf::str();
  local_1b0._M_len = local_1e8;
  local_1b0._M_str = local_1f0;
  native_error_exception::native_error_exception(this_00,syntax,&local_200,&local_1b0);
  __cxa_throw(this_00,&native_error_exception::typeinfo,
              native_error_exception::~native_error_exception);
}

Assistant:

completion operator()(const labelled_statement& s) {
        if (labels_valid_for_ != &s) {
            label_set_.clear();
        }
        if (std::find(label_set_.begin(), label_set_.end(), s.id()) != label_set_.end()) {
            std::wostringstream woss;
            woss << "Duplicate label " << s.id();
            throw native_error_exception(native_error_type::syntax, stack_trace(), woss.str());
        }
        label_set_.push_back(s.id());
        labels_valid_for_ = &s.s();
        return eval(s.s());
    }